

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

void ktxHashList_ConstructCopy(ktxHashList *pHead,ktxHashList orig)

{
  *pHead = (ktxHashList)0x0;
  for (; orig != (ktxHashList)0x0; orig = (ktxHashList)(orig->hh).next) {
    ktxHashList_AddKVPair(pHead,orig->key,orig->valueLen,orig->value);
  }
  return;
}

Assistant:

void
ktxHashList_ConstructCopy(ktxHashList* pHead, ktxHashList orig)
{
    ktxHashListEntry* entry = orig;
    *pHead = NULL;
    for (; entry != NULL; entry = ktxHashList_Next(entry)) {
        (void)ktxHashList_AddKVPair(pHead,
                                    entry->key, entry->valueLen, entry->value);
    }
}